

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Bullet(void)

{
  ImDrawList *draw_list;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  ImVec2 local_58;
  ImVec2 local_50;
  ImU32 local_48;
  ImU32 text_col;
  ImVec2 local_3c;
  undefined1 local_34 [8];
  ImRect bb;
  float line_height;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    register0x00000000 = &GImGui->Style;
    fVar4 = (GImGui->Style).FramePadding.y;
    fVar4 = ImMin<float>((pIVar3->DC).CurrLineSize.y,fVar4 + fVar4 + GImGui->FontSize);
    bb.Max.x = ImMax<float>(fVar4,pIVar1->FontSize);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,pIVar1->FontSize,bb.Max.x);
    local_3c = operator+(&(pIVar3->DC).CursorPos,(ImVec2 *)&stack0xffffffffffffffbc);
    ImRect::ImRect((ImRect *)local_34,&(pIVar3->DC).CursorPos,&local_3c);
    ItemSize((ImRect *)local_34,-1.0);
    bVar2 = ItemAdd((ImRect *)local_34,0,(ImRect *)0x0);
    if (bVar2) {
      local_48 = GetColorU32(0,1.0);
      draw_list = pIVar3->DrawList;
      ImVec2::ImVec2(&local_58,pIVar1->FontSize * 0.5 + (stack0xffffffffffffffe0->FramePadding).x,
                     bb.Max.x * 0.5);
      local_50 = operator+((ImVec2 *)local_34,&local_58);
      RenderBullet(draw_list,local_50,local_48);
      SameLine(0.0,(stack0xffffffffffffffe0->FramePadding).x * 2.0);
    }
    else {
      SameLine(0.0,(stack0xffffffffffffffe0->FramePadding).x * 2.0);
    }
  }
  return;
}

Assistant:

void ImGui::Bullet()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float line_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + g.Style.FramePadding.y*2), g.FontSize);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(g.FontSize, line_height));
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
    {
        SameLine(0, style.FramePadding.x*2);
        return;
    }

    // Render and stay on same line
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderBullet(window->DrawList, bb.Min + ImVec2(style.FramePadding.x + g.FontSize*0.5f, line_height*0.5f), text_col);
    SameLine(0, style.FramePadding.x * 2.0f);
}